

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

void __thiscall duckdb::AttachInfo::Serialize(AttachInfo *this,Serializer *serializer)

{
  ulong in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  ParseInfo::Serialize(&this->super_ParseInfo,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,200,"name",&this->name);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xc9,"path",&this->path);
  Serializer::
  WritePropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
            (serializer,0xca,"options",&this->options);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Serializer::WritePropertyWithDefault<duckdb::OnCreateConflict>
            (serializer,0xcb,"on_conflict",&this->on_conflict,
             (OnCreateConflict *)((long)&uStack_18 + 7));
  return;
}

Assistant:

void AttachInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "name", name);
	serializer.WritePropertyWithDefault<string>(201, "path", path);
	serializer.WritePropertyWithDefault<unordered_map<string, Value>>(202, "options", options);
	serializer.WritePropertyWithDefault<OnCreateConflict>(203, "on_conflict", on_conflict, OnCreateConflict::ERROR_ON_CONFLICT);
}